

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

CallInfo * luaD_precall(lua_State *L,StkId func,int nresults)

{
  byte bVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  CallInfo *pCVar5;
  uint status;
  lua_CFunction p_Var6;
  ulong uVar7;
  long lVar8;
  
  status = nresults + 1;
  while( true ) {
    bVar3 = (func->val).tt_ & 0x3f;
    if (bVar3 == 6) {
      lVar8 = *(long *)((func->val).value_.f + 0x18);
      uVar7 = (L->top).offset - (long)func;
      bVar3 = *(byte *)(lVar8 + 10);
      bVar1 = *(byte *)(lVar8 + 0xc);
      if ((long)(L->stack_last).p - (L->top).offset >> 4 <= (long)(ulong)bVar1) {
        lVar2 = (L->stack).offset;
        luaD_growstack(L,(uint)bVar1,1);
        func = (StkId)(((long)func - lVar2) + (long)(L->stack).p);
      }
      pCVar5 = L->ci->next;
      if (pCVar5 == (CallInfo *)0x0) {
        pCVar5 = luaE_extendCI(L);
      }
      (pCVar5->func).p = func;
      pCVar5->callstatus = status;
      (pCVar5->top).p = func + (ulong)bVar1 + 1;
      L->ci = pCVar5;
      (pCVar5->u).l.savedpc = *(Instruction **)(lVar8 + 0x40);
      iVar4 = (int)(uVar7 >> 4);
      if (iVar4 <= (int)(uint)bVar3) {
        iVar4 = ((uint)bVar3 - iVar4) + 1;
        do {
          lVar8 = (L->top).offset;
          (L->top).p = (StkId)(lVar8 + 0x10);
          *(undefined1 *)(lVar8 + 8) = 0;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      return pCVar5;
    }
    if (bVar3 == 0x16) break;
    if (bVar3 == 0x26) {
      p_Var6 = *(lua_CFunction *)((func->val).value_.f + 0x18);
      goto LAB_0010c7e2;
    }
    if ((long)(L->stack_last).p - (L->top).offset < 0x11) {
      lVar8 = (L->stack).offset;
      luaD_growstack(L,1,1);
      func = (StkId)(((long)func - lVar8) + (long)(L->stack).p);
    }
    status = tryfuncTM(L,func,status);
  }
  p_Var6 = (func->val).value_.f;
LAB_0010c7e2:
  lVar8 = (L->top).offset;
  if ((long)(L->stack_last).p - lVar8 < 0x150) {
    lVar8 = (L->stack).offset;
    luaD_growstack(L,0x14,1);
    func = (StkId)(((long)func - lVar8) + (long)(L->stack).p);
    lVar8 = (L->top).offset;
  }
  pCVar5 = L->ci->next;
  if (pCVar5 == (CallInfo *)0x0) {
    pCVar5 = luaE_extendCI(L);
  }
  (pCVar5->func).p = func;
  pCVar5->callstatus = status | 0x8000;
  (pCVar5->top).p = (StkId)(lVar8 + 0x140);
  L->ci = pCVar5;
  if ((L->hookmask & 1U) != 0) {
    luaD_hook(L,0,-1,1,(int)((ulong)((long)(L->top).p - (long)func) >> 4) + -1);
  }
  iVar4 = (*p_Var6)(L);
  luaD_poscall(L,pCVar5,iVar4);
  return (CallInfo *)0x0;
}

Assistant:

CallInfo *luaD_precall (lua_State *L, StkId func, int nresults) {
  unsigned status = cast_uint(nresults + 1);
  lua_assert(status <= MAXRESULTS + 1);
 retry:
  switch (ttypetag(s2v(func))) {
    case LUA_VCCL:  /* C closure */
      precallC(L, func, status, clCvalue(s2v(func))->f);
      return NULL;
    case LUA_VLCF:  /* light C function */
      precallC(L, func, status, fvalue(s2v(func)));
      return NULL;
    case LUA_VLCL: {  /* Lua function */
      CallInfo *ci;
      Proto *p = clLvalue(s2v(func))->p;
      int narg = cast_int(L->top.p - func) - 1;  /* number of real arguments */
      int nfixparams = p->numparams;
      int fsize = p->maxstacksize;  /* frame size */
      checkstackp(L, fsize, func);
      L->ci = ci = prepCallInfo(L, func, status, func + 1 + fsize);
      ci->u.l.savedpc = p->code;  /* starting point */
      for (; narg < nfixparams; narg++)
        setnilvalue(s2v(L->top.p++));  /* complete missing arguments */
      lua_assert(ci->top.p <= L->stack_last.p);
      return ci;
    }
    default: {  /* not a function */
      checkstackp(L, 1, func);  /* space for metamethod */
      status = tryfuncTM(L, func, status);  /* try '__call' metamethod */
      goto retry;  /* try again with metamethod */
    }
  }
}